

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

SPPParameter * __thiscall caffe::SPPParameter::New(SPPParameter *this,Arena *arena)

{
  SPPParameter *this_00;
  SPPParameter *n;
  Arena *arena_local;
  SPPParameter *this_local;
  
  this_00 = (SPPParameter *)operator_new(0x28);
  SPPParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::SPPParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

SPPParameter* SPPParameter::New(::google::protobuf::Arena* arena) const {
  SPPParameter* n = new SPPParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}